

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

bool __thiscall LinearSystem::Choice(LinearSystem *this,int pos,ChoiceType choice_type)

{
  ExtendedMatrix *this_00;
  LinearSystem *this_01;
  bool bVar1;
  Fraction *a;
  Fraction *pFVar2;
  Fraction extraout_RAX;
  int row;
  int row_00;
  ulong uVar3;
  int column;
  int column_00;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  double __x;
  double __x_00;
  int local_68;
  int local_64;
  Fraction best_item;
  Fraction local_58;
  LinearSystem *local_50;
  ulong local_48;
  Fraction local_40;
  Fraction local_38;
  
  uVar3 = (ulong)(uint)pos;
  local_68 = this->n_;
  if (choice_type == Column) {
    iVar5 = pos + 1;
  }
  else {
    iVar5 = this->m_;
    if (choice_type == Row) {
      local_68 = pos + 1;
    }
    else if (choice_type == Without) {
      a = ExtendedMatrix::At(&this->system_,pos,pos);
      pFVar2 = &best_item;
      Fraction::Fraction(pFVar2,0);
      goto LAB_0010ae45;
    }
  }
  this_00 = &this->system_;
  local_50 = this;
  pFVar2 = ExtendedMatrix::At(this_00,pos,pos);
  best_item = *pFVar2;
  uVar6 = uVar3;
  local_64 = pos;
  local_48 = uVar3;
  while (uVar4 = local_48, row_00 = (int)uVar3, row_00 < local_68) {
    while (column_00 = (int)uVar4, column_00 < iVar5) {
      ExtendedMatrix::At(this_00,row_00,column_00);
      fabs(__x);
      bVar1 = operator<(&best_item,&local_58);
      if (bVar1) {
        ExtendedMatrix::At(this_00,row_00,column_00);
        fabs(__x_00);
        uVar6 = uVar3;
        local_64 = column_00;
        best_item = extraout_RAX;
      }
      uVar4 = (ulong)(column_00 + 1);
    }
    uVar3 = (ulong)(row_00 + 1);
  }
  Fraction::Fraction(&local_38,0);
  this_01 = local_50;
  PerformOperation(local_50,SwapRows,(int)uVar4,(int)uVar6,local_38);
  Fraction::Fraction(&local_40,0);
  PerformOperation(this_01,SwapColumns,(int)uVar4,local_64,local_40);
  AddMainOutput(this_01);
  pFVar2 = &local_58;
  Fraction::Fraction(pFVar2,0);
  a = &best_item;
LAB_0010ae45:
  bVar1 = operator!=(a,pFVar2);
  return bVar1;
}

Assistant:

bool LinearSystem::Choice(int pos, Options::ChoiceType choice_type) {
  int max_row = n_, max_column = m_;
  if (choice_type == Options::ChoiceType::Without) {
    return system_.At(pos, pos) != 0;
  } else if (choice_type == Options::ChoiceType::Row) {
    max_row = pos + 1;
  } else if (choice_type == Options::ChoiceType::Column) {
    max_column = pos + 1;
  }

  int best_column = pos, best_row = pos;
  Fraction best_item = system_.At(pos, pos);
  for (int row = pos; row < max_row; ++row) {
    for (int column = pos; column < max_column; ++column) {
      if (best_item < fabs(system_.At(row, column))) {
        best_row = row;
        best_column = column;
        best_item = fabs(system_.At(row, column));
      }
    }
  }

  PerformOperation(OperationType::SwapRows, pos, best_row, 0);
  PerformOperation(OperationType::SwapColumns, pos, best_column, 0);

  AddMainOutput();

  return best_item != 0;
}